

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_all(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS RVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  uVar1 = ref_validation_unused_node(ref_grid);
  if (uVar1 == 0) {
    uVar1 = ref_validation_boundary_face(ref_grid);
    if (uVar1 == 0) {
      uVar1 = ref_validation_cell_face(ref_grid);
      if (uVar1 == 0) {
        RVar2 = ref_validation_cell_node(ref_grid);
        if (RVar2 == 0) {
          uVar1 = ref_validation_cell_volume(ref_grid);
          if (uVar1 == 0) {
            return 0;
          }
          pcVar4 = "cell volume";
          uVar3 = 0x1d3;
        }
        else {
          pcVar4 = "cell node";
          uVar1 = 1;
          uVar3 = 0x1d2;
        }
      }
      else {
        pcVar4 = "cell face";
        uVar3 = 0x1d1;
      }
    }
    else {
      pcVar4 = "boundary face";
      uVar3 = 0x1d0;
    }
  }
  else {
    pcVar4 = "unused node";
    uVar3 = 0x1cf;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
         uVar3,"ref_validation_all",(ulong)uVar1,pcVar4);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_validation_all(REF_GRID ref_grid) {
  RSS(ref_validation_unused_node(ref_grid), "unused node");
  RSS(ref_validation_boundary_face(ref_grid), "boundary face");
  RSS(ref_validation_cell_face(ref_grid), "cell face");
  RSS(ref_validation_cell_node(ref_grid), "cell node");
  RSS(ref_validation_cell_volume(ref_grid), "cell volume");

  return REF_SUCCESS;
}